

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

void * clDeviceMemAllocINTEL
                 (cl_context context,cl_device_id device,cl_mem_properties_intel *properties,
                 size_t size,cl_uint alignment,cl_int *errcode_ret)

{
  ulong uVar1;
  void *pvVar2;
  cl_int errorCode;
  CLIntercept *this;
  CLdispatchX *pCVar3;
  CLIntercept *enqueueCounter_00;
  SConfig *pSVar4;
  undefined8 uVar5;
  time_point tVar6;
  CObjectTracker *this_00;
  size_t in_RCX;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDX;
  cl_device_id in_RSI;
  cl_context in_RDI;
  cl_uint in_R8D;
  uint *in_R9;
  time_point cpuEnd;
  time_point cpuStart;
  cl_int localErrorCode;
  string deviceInfo;
  void *retVal;
  cl_mem_properties_intel *newProperties;
  uint64_t enqueueCounter;
  CLdispatchX *dispatchX;
  CLIntercept *pIntercept;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffd90;
  CLIntercept *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  cl_mem_properties_intel **in_stack_fffffffffffffdc0;
  cl_mem_properties_intel *in_stack_fffffffffffffdc8;
  CLIntercept *in_stack_fffffffffffffdd0;
  SConfig *in_stack_fffffffffffffe20;
  SConfig *in_stack_fffffffffffffe28;
  undefined1 includeId;
  SConfig *in_stack_fffffffffffffe30;
  SConfig *in_stack_fffffffffffffe38;
  CLIntercept *in_stack_fffffffffffffe40;
  time_point in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  time_point in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffee8;
  cl_device_id *in_stack_fffffffffffffef0;
  string local_108 [4];
  cl_uint in_stack_fffffffffffffefc;
  CLIntercept *in_stack_ffffffffffffff00;
  uint local_90 [4];
  string local_80 [36];
  cl_mem_properties_intel *pcVar7;
  char *functionName;
  CLIntercept *this_01;
  uint *local_38;
  
  this = GetIntercept();
  if ((this == (CLIntercept *)0x0) ||
     (pCVar3 = CLIntercept::dispatchX
                         ((CLIntercept *)
                          CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                          (cl_context)in_stack_fffffffffffffd98),
     pCVar3->clDeviceMemAllocINTEL ==
     (_func_void_ptr_cl_context_cl_device_id_cl_mem_properties_intel_ptr_size_t_cl_uint_cl_int_ptr *
     )0x0)) {
    return (void *)0x0;
  }
  enqueueCounter_00 = (CLIntercept *)CLIntercept::getEnqueueCounter(in_stack_fffffffffffffd98);
  pcVar7 = (cl_mem_properties_intel *)0x0;
  stack0xffffffffffffffa0 = (void *)0x0;
  std::__cxx11::string::string(local_80);
  pSVar4 = CLIntercept::config(this);
  if ((pSVar4->CallLogging & 1U) != 0) {
    CLIntercept::getDeviceInfoString
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8);
  }
  pSVar4 = CLIntercept::config(this);
  this_01 = enqueueCounter_00;
  if ((pSVar4->CallLogging & 1U) != 0) {
    uVar5 = std::__cxx11::string::c_str();
    in_stack_fffffffffffffd90 = in_RDX;
    CLIntercept::callLoggingEnter
              (this,"clDeviceMemAllocINTEL",(uint64_t)enqueueCounter_00,(cl_kernel)0x0,
               "context = %p, device = %s, properties = %p, size = %zu, alignment = %u",in_RDI,uVar5
               ,in_RDX,in_RCX,in_R8D);
  }
  pSVar4 = CLIntercept::config(this);
  if ((pSVar4->RelaxAllocationLimits & 1U) != 0) {
    CLIntercept::usmAllocPropertiesOverride
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  }
  local_90[0] = 0;
  pSVar4 = CLIntercept::config(this);
  local_38 = in_R9;
  if ((((((pSVar4->CallLogging & 1U) != 0) ||
        (pSVar4 = CLIntercept::config(this), (pSVar4->ErrorLogging & 1U) != 0)) ||
       (pSVar4 = CLIntercept::config(this), (pSVar4->ErrorAssert & 1U) != 0)) ||
      (pSVar4 = CLIntercept::config(this), (pSVar4->NoErrors & 1U) != 0)) && (in_R9 == (uint *)0x0))
  {
    local_38 = local_90;
  }
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_fffffffffffffd90);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_fffffffffffffd90);
  pSVar4 = CLIntercept::config(this);
  if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
     (pSVar4 = CLIntercept::config(this), (pSVar4->ChromeCallLogging & 1U) != 0)) {
    std::chrono::_V2::steady_clock::now();
  }
  if ((stack0xffffffffffffffa0 == (void *)0x0) && (pcVar7 != (cl_mem_properties_intel *)0x0)) {
    register0x00000000 =
         (*pCVar3->clDeviceMemAllocINTEL)(in_RDI,in_RSI,pcVar7,in_RCX,in_R8D,(cl_int *)local_38);
  }
  if (stack0xffffffffffffffa0 == (void *)0x0) {
    register0x00000000 =
         (*pCVar3->clDeviceMemAllocINTEL)
                   (in_RDI,in_RSI,(cl_mem_properties_intel *)in_RDX,in_RCX,in_R8D,(cl_int *)local_38
                   );
  }
  pSVar4 = CLIntercept::config(this);
  if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
     (in_stack_fffffffffffffe60.__d.__r = (duration)CLIntercept::config(this),
     (((SConfig *)in_stack_fffffffffffffe60.__d.__r)->ChromeCallLogging & 1U) != 0)) {
    std::chrono::_V2::steady_clock::now();
    tVar6.__d.__r = (duration)CLIntercept::config(this);
    if (((((SConfig *)tVar6.__d.__r)->HostPerformanceTiming & 1U) != 0) &&
       (in_stack_fffffffffffffe57 =
             CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,(uint64_t)this_01),
       (bool)in_stack_fffffffffffffe57)) {
      in_stack_fffffffffffffe48.__d.__r = (duration)&stack0xffffffffffffff2f;
      in_stack_fffffffffffffe40 = this;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff30,"",
                 (allocator *)in_stack_fffffffffffffe48.__d.__r);
      CLIntercept::updateHostTimingStats
                ((CLIntercept *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 (char *)in_stack_fffffffffffffe48.__d.__r,(string *)in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe60,tVar6);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
    }
  }
  includeId = (undefined1)((ulong)in_stack_fffffffffffffe28 >> 0x38);
  if (stack0xffffffffffffffa0 != (void *)0x0) {
    in_stack_fffffffffffffe38 = CLIntercept::config(this);
    if (((((in_stack_fffffffffffffe38->DumpBuffersBeforeEnqueue & 1U) == 0) &&
         (in_stack_fffffffffffffe30 = CLIntercept::config(this),
         (in_stack_fffffffffffffe30->DumpBuffersAfterEnqueue & 1U) == 0)) &&
        (in_stack_fffffffffffffe28 = CLIntercept::config(this),
        (in_stack_fffffffffffffe28->InjectBuffers & 1U) == 0)) &&
       (in_stack_fffffffffffffe20 = CLIntercept::config(this),
       (in_stack_fffffffffffffe20->InjectImages & 1U) == 0)) {
      pSVar4 = CLIntercept::config(this);
      includeId = (undefined1)((ulong)in_stack_fffffffffffffe28 >> 0x38);
      if ((pSVar4->CaptureReplay & 1U) == 0) goto LAB_00179de2;
    }
    includeId = (undefined1)((ulong)in_stack_fffffffffffffe28 >> 0x38);
    CLIntercept::addUSMAllocation
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(size_t)in_stack_fffffffffffffdc0
              );
  }
LAB_00179de2:
  if (pcVar7 != (cl_mem_properties_intel *)0x0) {
    operator_delete__(pcVar7);
  }
  functionName = (char *)0x0;
  pSVar4 = CLIntercept::config(this);
  if (((((pSVar4->ErrorLogging & 1U) != 0) ||
       (pSVar4 = CLIntercept::config(this), (pSVar4->ErrorAssert & 1U) != 0)) ||
      (pSVar4 = CLIntercept::config(this), (pSVar4->NoErrors & 1U) != 0)) && (*local_38 != 0)) {
    pSVar4 = CLIntercept::config(this);
    pvVar2 = stack0xffffffffffffffa0;
    if ((pSVar4->ErrorLogging & 1U) != 0) {
      uVar1 = (ulong)stack0xffffffffffffffa0 >> 0x20;
      errorCode = (cl_int)uVar1;
      unique0x10000873 = pvVar2;
      CLIntercept::logError(this_01,functionName,errorCode);
    }
    pSVar4 = CLIntercept::config(this);
    if ((pSVar4->ErrorAssert & 1U) != 0) {
      raise(5);
    }
    pSVar4 = CLIntercept::config(this);
    if ((pSVar4->NoErrors & 1U) != 0) {
      *local_38 = 0;
    }
  }
  pSVar4 = CLIntercept::config(this);
  if ((pSVar4->LeakChecking & 1U) != 0) {
    this_00 = CLIntercept::objectTracker(this);
    CObjectTracker::AddPointerAllocation(this_00,stack0xffffffffffffffa0);
  }
  pSVar4 = CLIntercept::config(this);
  if ((pSVar4->CallLogging & 1U) != 0) {
    CLIntercept::callLoggingExit
              (this,"clDeviceMemAllocINTEL",(cl_int)(ulong)*local_38,(cl_event *)0x0,
               (cl_sync_point_khr *)0x0,"returned %p",stack0xffffffffffffffa0);
  }
  pSVar4 = CLIntercept::config(this);
  if ((pSVar4->ChromeCallLogging & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"",(allocator *)&stack0xfffffffffffffef7);
    tVar6.__d.__r._7_1_ = in_stack_fffffffffffffe57;
    tVar6.__d.__r._0_7_ = in_stack_fffffffffffffe50;
    CLIntercept::chromeCallLoggingExit
              (in_stack_fffffffffffffe40,&in_stack_fffffffffffffe38->SuppressLogging,
               (string *)in_stack_fffffffffffffe30,(bool)includeId,
               (uint64_t)in_stack_fffffffffffffe20,tVar6,in_stack_fffffffffffffe48);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
  }
  pvVar2 = stack0xffffffffffffffa0;
  std::__cxx11::string::~string(local_80);
  return pvVar2;
}

Assistant:

CL_API_ENTRY void* CL_API_CALL clDeviceMemAllocINTEL(
    cl_context context,
    cl_device_id device,
    const cl_mem_properties_intel* properties,
    size_t size,
    cl_uint alignment,
    cl_int* errcode_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(context);
        if( dispatchX.clDeviceMemAllocINTEL )
        {
            GET_ENQUEUE_COUNTER();

            cl_mem_properties_intel*    newProperties = NULL;
            void*   retVal = NULL;

            std::string deviceInfo;
            if( pIntercept->config().CallLogging )
            {
                pIntercept->getDeviceInfoString(
                    1,
                    &device,
                    deviceInfo );
            }
            // TODO: Make properties string.
            CALL_LOGGING_ENTER( "context = %p, device = %s, properties = %p, size = %zu, alignment = %u",
                context,
                deviceInfo.c_str(),
                properties,
                size,
                alignment );
            USM_ALLOC_OVERRIDE_INIT( properties, newProperties );
            CHECK_ERROR_INIT( errcode_ret );
            HOST_PERFORMANCE_TIMING_START();

            if( ( retVal == NULL ) && newProperties )
            {
                retVal = dispatchX.clDeviceMemAllocINTEL(
                    context,
                    device,
                    newProperties,
                    size,
                    alignment,
                    errcode_ret );
            }
            if( retVal == NULL )
            {
                retVal = dispatchX.clDeviceMemAllocINTEL(
                    context,
                    device,
                    properties,
                    size,
                    alignment,
                    errcode_ret );
            }

            HOST_PERFORMANCE_TIMING_END();
            ADD_USM_ALLOCATION( retVal, size );
            USM_ALLOC_PROPERTIES_CLEANUP( newProperties );
            CHECK_ERROR( errcode_ret[0] );
            ADD_POINTER_ALLOCATION( retVal );
            CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

            return retVal;
        }
    }

    return NULL;
}